

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void solvegotos(FuncState *fs,BlockCnt *bl)

{
  LexState *ls_00;
  Dyndata *pDVar1;
  byte bVar2;
  byte bVar3;
  Labeldesc *pLVar4;
  Labeldesc *label;
  Labeldesc *lb;
  Labeldesc *gt;
  int igt;
  int outlevel;
  Labellist *gl;
  LexState *ls;
  BlockCnt *bl_local;
  FuncState *fs_local;
  
  ls_00 = fs->ls;
  pDVar1 = ls_00->dyd;
  bVar2 = reglevel(fs,(uint)bl->nactvar);
  gt._0_4_ = bl->firstgoto;
  while ((int)gt < (pDVar1->gt).n) {
    pLVar4 = (pDVar1->gt).arr + (int)gt;
    label = findlabel(ls_00,pLVar4->name,bl->firstlabel);
    if (label == (Labeldesc *)0x0) {
      if ((bl->upval != '\0') && (bVar3 = reglevel(fs,(uint)pLVar4->nactvar), bVar2 < bVar3)) {
        pLVar4->close = '\x01';
      }
      pLVar4->nactvar = bl->nactvar;
      gt._0_4_ = (int)gt + 1;
    }
    else {
      closegoto(ls_00,(int)gt,label,(uint)bl->upval);
    }
  }
  (ls_00->dyd->label).n = bl->firstlabel;
  return;
}

Assistant:

static void solvegotos (FuncState *fs, BlockCnt *bl) {
  LexState *ls = fs->ls;
  Labellist *gl = &ls->dyd->gt;
  int outlevel = reglevel(fs, bl->nactvar);  /* level outside the block */
  int igt = bl->firstgoto;  /* first goto in the finishing block */
  while (igt < gl->n) {   /* for each pending goto */
    Labeldesc *gt = &gl->arr[igt];
    /* search for a matching label in the current block */
    Labeldesc *lb = findlabel(ls, gt->name, bl->firstlabel);
    if (lb != NULL)  /* found a match? */
      closegoto(ls, igt, lb, bl->upval);  /* close and remove goto */
    else {  /* adjust 'goto' for outer block */
      /* block has variables to be closed and goto escapes the scope of
         some variable? */
      if (bl->upval && reglevel(fs, gt->nactvar) > outlevel)
        gt->close = 1;  /* jump may need a close */
      gt->nactvar = bl->nactvar;  /* correct level for outer block */
      igt++;  /* go to next goto */
    }
  }
  ls->dyd->label.n = bl->firstlabel;  /* remove local labels */
}